

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::ssbo_block_shared_qualifier
               (NegativeTestContext *ctx)

{
  ostringstream *poVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  ContextType ctxType;
  GLuint program;
  GLuint shader;
  char *__s;
  SsboArgs *in_RCX;
  SsboArgs *args;
  long lVar4;
  TestLog *in_R8;
  TestLog *log;
  ulong uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  GLint linkStatus;
  string shaderFragmentString;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  argDataVectorFrag;
  string message;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  argDataVectorVert;
  char *shaderFragmentCharPtr;
  string shaderVertexString;
  char *shaderVertexCharPtr;
  string versionString;
  SsboArgData argDataArrayFrag [3];
  SsboArgData argDataArrayVert [6];
  SsboArgs ssboArgs;
  ArgMember local_5bc;
  GLuint local_5b8;
  ArgMember local_5b4;
  string local_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_590;
  string local_588;
  char *local_568;
  char *local_560;
  char local_558;
  undefined7 uStack_557;
  ArgMember local_548 [4];
  string local_538;
  string local_518;
  char *local_4f8;
  undefined8 local_4f0;
  char local_4e8;
  undefined7 uStack_4e7;
  undefined1 local_4d8 [8];
  _Alloc_hider local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  ulong local_4b0;
  undefined1 local_4a8 [8];
  string local_4a0;
  char *local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  local_460;
  undefined1 local_448 [40];
  SsboArgData local_420;
  SsboArgData local_3f8;
  undefined1 local_3d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0 [6];
  ios_base local_358 [264];
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  local_250;
  SsboArgData local_238;
  SsboArgData local_210;
  SsboArgData local_1e8;
  SsboArgData local_1c0;
  SsboArgData local_198;
  SsboArgData local_170;
  undefined1 local_148 [280];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ctx->super_CallLogWrapper).m_log;
  local_568 = &local_558;
  local_560 = (char *)0x0;
  local_558 = '\0';
  __s = glu::getGLSLVersionDeclaration(bVar3 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,__s,(allocator<char> *)local_3d0);
  local_4a0._M_dataplus._M_p = local_4a8 + 0x18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4a8 + 8),local_480,local_480 + local_478._M_allocated_capacity);
  anon_unknown_0::args::SsboArgs::SsboArgs
            ((SsboArgs *)(local_148 + 8),(string *)(local_4a8 + 8),
             (TestLog *)&local_590->_M_allocated_capacity);
  if (local_4a0._M_dataplus._M_p != local_4a8 + 0x18) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  local_4f8 = &local_4e8;
  local_4f0 = 0;
  local_4e8 = '\0';
  local_5bc = ARGMEMBER_FORMAT;
  local_3d0._0_8_ = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"shared","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_238,&local_5bc,(string *)local_3d0);
  local_5b4 = ARGMEMBER_BINDING_POINT;
  local_448._0_8_ = local_448 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"0","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_210,&local_5b4,(string *)local_448);
  local_548[3] = 2;
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"column_major","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_1e8,local_548 + 3,&local_5b0);
  local_548[2] = 5;
  paVar6 = &local_588.field_2;
  local_588._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"10","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_1c0,local_548 + 2,&local_588);
  local_548[1] = 6;
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"10","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_198,local_548 + 1,&local_538);
  local_548[0] = ARGMEMBER_REORDER;
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"false","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_170,local_548,&local_518);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != paVar6) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,
                    CONCAT71(local_5b0.field_2._M_allocated_capacity._1_7_,
                             local_5b0.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
    operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._0_8_ != local_3c0) {
    operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
  ::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData_const*,void>
            ((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
              *)&local_538,&local_238,(SsboArgData *)local_148,(allocator_type *)in_RCX);
  local_518._M_dataplus._M_p._0_4_ = 2;
  local_3d0._0_8_ = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"row_major","");
  anon_unknown_0::args::SsboArgData::SsboArgData
            ((SsboArgData *)local_448,(ArgMember *)&local_518,(string *)local_3d0);
  local_5bc = ARGMEMBER_VARIABLE_ARRAY;
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,0x1b32ab9);
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_420,&local_5bc,&local_5b0);
  local_5b4 = ARGMEMBER_FIXED_ARRAY;
  local_588._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"20","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_3f8,&local_5b4,&local_588);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != paVar6) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,
                    CONCAT71(local_5b0.field_2._M_allocated_capacity._1_7_,
                             local_5b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._0_8_ != local_3c0) {
    operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
  ::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData_const*,void>
            ((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
              *)&local_588,(SsboArgData *)local_448,(SsboArgData *)local_3d0,
             (allocator_type *)in_RCX);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::vector(&local_460,
           (vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
            *)&local_538);
  bVar3 = anon_unknown_0::args::SsboArgs::setAllValues((SsboArgs *)(local_148 + 8),&local_460);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector(&local_460);
  if (bVar3) {
    NegativeTestShared::(anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
              ((string *)local_3d0,(_anonymous_namespace_ *)0x8b31,(int)local_148 + 8,in_RCX,in_R8);
    std::__cxx11::string::operator=((string *)&local_4f8,(string *)local_3d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ != local_3c0) {
      operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
    }
    local_4a8 = (undefined1  [8])local_4f8;
    local_5b8 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
    std::__cxx11::string::_M_assign((string *)&local_568);
    poVar1 = (ostringstream *)(local_3d0 + 8);
    local_3d0._0_8_ = local_590;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_568,(long)local_560);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_358);
    args = (SsboArgs *)local_4a8;
    log = (TestLog *)0x0;
    glu::CallLogWrapper::glShaderSource
              (&ctx->super_CallLogWrapper,local_5b8,1,(GLchar **)args,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,local_5b8);
    if ((pointer)local_588._M_string_length != local_588._M_dataplus._M_p) {
      lVar4 = 0x10;
      uVar5 = 0;
      do {
        _Var2._M_p = local_588._M_dataplus._M_p;
        local_5bc = ~ARGMEMBER_FORMAT;
        local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
        local_5b0._M_string_length = 0;
        local_5b0.field_2._M_local_buf[0] = '\0';
        local_3d0._0_8_ = local_3c0;
        local_4b0 = uVar5;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3d0,
                   "Multiple shaders created using SSBO\'s sharing the same name but not matching layouts"
                   ,"");
        NegativeTestContext::beginSection(ctx,(string *)local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._0_8_ != local_3c0) {
          operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
        }
        program = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
        std::
        vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
        ::vector(&local_250,
                 (vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                  *)&local_538);
        anon_unknown_0::args::SsboArgs::setAllValues((SsboArgs *)(local_148 + 8),&local_250);
        std::
        vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
        ::~vector(&local_250);
        local_4d8._0_4_ = *(undefined4 *)(_Var2._M_p + lVar4 + -0x10);
        local_4d0._M_p = (pointer)&local_4c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4d0,*(long *)(_Var2._M_p + lVar4 + -8),
                   *(long *)(_Var2._M_p + lVar4) + *(long *)(_Var2._M_p + lVar4 + -8));
        anon_unknown_0::args::SsboArgs::setSingleValue
                  ((SsboArgs *)(local_148 + 8),(SsboArgData *)local_4d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_p != &local_4c0) {
          operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
                  ((string *)local_3d0,(_anonymous_namespace_ *)0x8b30,(int)local_148 + 8,args,log);
        std::__cxx11::string::operator=((string *)&local_5b0,(string *)local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._0_8_ != local_3c0) {
          operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
        }
        local_518._M_dataplus._M_p = local_5b0._M_dataplus._M_p;
        shader = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b30);
        std::__cxx11::string::_M_assign((string *)&local_568);
        local_3d0._0_8_ = local_590;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_3d0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_3d0 + 8),local_568,(long)local_560);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_3d0 + 8));
        std::ios_base::~ios_base(local_358);
        log = (TestLog *)0x0;
        glu::CallLogWrapper::glShaderSource
                  (&ctx->super_CallLogWrapper,shader,1,(GLchar **)&local_518,(GLint *)0x0);
        glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,shader);
        glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,local_5b8);
        glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,shader);
        glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program);
        glu::CallLogWrapper::glGetProgramiv
                  (&ctx->super_CallLogWrapper,program,0x8b82,(GLint *)&local_5bc);
        logProgramInfo(ctx,program);
        if (local_5bc == ARGMEMBER_BINDING_POINT) {
          local_3d0._0_8_ = local_3c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3d0,"Program should not have linked","");
          NegativeTestContext::fail(ctx,(string *)local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._0_8_ != local_3c0) {
            operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
          }
        }
        glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader);
        glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program);
        NegativeTestContext::endSection(ctx);
        uVar5 = local_4b0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,
                          CONCAT71(local_5b0.field_2._M_allocated_capacity._1_7_,
                                   local_5b0.field_2._M_local_buf[0]) + 1);
        }
        uVar5 = uVar5 + 1;
        args = (SsboArgs *)0xcccccccccccccccd;
        lVar4 = lVar4 + 0x28;
      } while (uVar5 < (ulong)(((long)(local_588._M_string_length - (long)local_588._M_dataplus._M_p
                                      ) >> 3) * -0x3333333333333333));
    }
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,local_5b8);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_568,0,local_560,0x1ccca82);
    poVar1 = (ostringstream *)(local_3d0 + 8);
    local_3d0._0_8_ = local_590;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_568,(long)local_560);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_358);
  }
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
             *)&local_588);
  lVar4 = -0x78;
  paVar6 = &local_3f8.data.field_2;
  do {
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar6->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],paVar6->_M_allocated_capacity + 1
                     );
    }
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar6->_M_allocated_capacity + -5);
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
             *)&local_538);
  lVar4 = -0xf0;
  paVar6 = &local_170.data.field_2;
  do {
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar6->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],paVar6->_M_allocated_capacity + 1
                     );
    }
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar6->_M_allocated_capacity + -5);
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0);
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8,CONCAT71(uStack_4e7,local_4e8) + 1);
  }
  anon_unknown_0::args::SsboArgs::~SsboArgs((SsboArgs *)(local_148 + 8));
  if (local_480 != local_478._M_local_buf + 8) {
    operator_delete(local_480,local_478._8_8_ + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,CONCAT71(uStack_557,local_558) + 1);
  }
  return;
}

Assistant:

void ssbo_block_shared_qualifier(NegativeTestContext& ctx)
{
	const bool				isES32													=	contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version													=	isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	tcu::TestLog&			log														=	ctx.getLog();
	std::string				message;
	std::string				versionString(glu::getGLSLVersionDeclaration(version));
	args::SsboArgs			ssboArgs(versionString, log);
	bool					result;
	GLint					shaderVertexGL;
	std::string				shaderVertexString;
	const char*				shaderVertexCharPtr;

	// default args used in vertex shader ssbo
	const args::SsboArgData argDataArrayVert[] = {	args::SsboArgData(args::ARGMEMBER_FORMAT,			"shared"),
													args::SsboArgData(args::ARGMEMBER_BINDING_POINT,	"0"),
													args::SsboArgData(args::ARGMEMBER_MATRIX_ORDER,		"column_major"),
													args::SsboArgData(args::ARGMEMBER_FIXED_ARRAY,		"10"),
													args::SsboArgData(args::ARGMEMBER_VARIABLE_ARRAY,	"10"),
													args::SsboArgData(args::ARGMEMBER_REORDER,			"false") };
	std::vector<args::SsboArgData> argDataVectorVert(argDataArrayVert, argDataArrayVert + sizeof(argDataArrayVert) / sizeof(argDataArrayVert[0]));

	// args changed in fragment shader ssbo
	const args::SsboArgData argDataArrayFrag[] = {	args::SsboArgData(args::ARGMEMBER_MATRIX_ORDER,		"row_major"),
													args::SsboArgData(args::ARGMEMBER_VARIABLE_ARRAY,	""),
													args::SsboArgData(args::ARGMEMBER_FIXED_ARRAY,		"20") };
	std::vector<args::SsboArgData> argDataVectorFrag(argDataArrayFrag, argDataArrayFrag + sizeof(argDataArrayFrag) / sizeof(argDataArrayFrag[0]));

	// set default vertex ssbo args
	result = ssboArgs.setAllValues(argDataVectorVert);

	if (result == false)
	{
		message = "Invalid use of args.setAllValues()";
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		return;
	}

	// create default vertex shader
	shaderVertexString = generateVaryingSSBOShader(GL_VERTEX_SHADER, ssboArgs, log);
	shaderVertexCharPtr = shaderVertexString.c_str();
	shaderVertexGL = ctx.glCreateShader(GL_VERTEX_SHADER);

	// log
	message = shaderVertexString;
	log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

	// compile
	ctx.glShaderSource(shaderVertexGL, 1, &shaderVertexCharPtr, DE_NULL);
	ctx.glCompileShader(shaderVertexGL);

	for (std::size_t idx = 0; idx < argDataVectorFrag.size(); idx++)
	{
		GLint		linkStatus				=	-1;
		GLint		program;
		GLint		shaderFragmentGL;
		std::string	shaderFragmentString;
		const char*	shaderFragmentCharPtr;

		ctx.beginSection("Multiple shaders created using SSBO's sharing the same name but not matching layouts");

		program = ctx.glCreateProgram();

		// reset args to default and make a single change
		ssboArgs.setAllValues(argDataVectorVert);
		ssboArgs.setSingleValue(argDataVectorFrag[idx]);

		// create fragment shader
		shaderFragmentString = generateVaryingSSBOShader(GL_FRAGMENT_SHADER, ssboArgs, log);
		shaderFragmentCharPtr = shaderFragmentString.c_str();
		shaderFragmentGL = ctx.glCreateShader(GL_FRAGMENT_SHADER);

		// log
		message = shaderFragmentString;
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

		// compile
		ctx.glShaderSource(shaderFragmentGL, 1, &shaderFragmentCharPtr, DE_NULL);
		ctx.glCompileShader(shaderFragmentGL);

		// attach shaders to the program and attempt to link
		ctx.glAttachShader(program, shaderVertexGL);
		ctx.glAttachShader(program, shaderFragmentGL);
		ctx.glLinkProgram(program);
		ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);

		logProgramInfo(ctx, program);

		if (linkStatus == GL_TRUE)
		{
			ctx.fail("Program should not have linked");
		}

		// clean up resources
		ctx.glDeleteShader(shaderFragmentGL);
		ctx.glDeleteProgram(program);

		ctx.endSection();
	}

	// clean up default resources
	ctx.glDeleteShader(shaderVertexGL);
}